

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void write_string(StringArray *string_array,char *string,size_t length)

{
  uint uVar1;
  String *pSVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = string_array->count;
  uVar1 = string_array->cap;
  if (uVar3 < uVar1) {
    pSVar2 = string_array->strings;
  }
  else {
    uVar4 = 8;
    if (7 < uVar1) {
      uVar4 = (ulong)(uVar1 * 2);
    }
    string_array->cap = (uint32_t)uVar4;
    pSVar2 = (String *)reallocate(string_array->strings,uVar4 << 4);
    string_array->strings = pSVar2;
    uVar3 = string_array->count;
  }
  pSVar2[uVar3].start = string;
  pSVar2[uVar3].length = length;
  string_array->count = uVar3 + 1;
  return;
}

Assistant:

static void write_string(StringArray *string_array, char *string, size_t length) {
    if (string_array->count >= string_array->cap) {
        string_array->cap = GROW_CAP(string_array->cap);
        string_array->strings = GROW_ARR(string_array->strings, String, string_array->cap);
    }

    string_array->strings[string_array->count].start = string;
    string_array->strings[string_array->count].length = length;
    ++string_array->count;
}